

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

size_t wallet::GetSerializeSizeForRecipient(CRecipient *recipient)

{
  uint uVar1;
  CScript scriptPubKeyIn;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa8 [16];
  uint local_44;
  CTxOut local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)&stack0xffffffffffffffa0,&recipient->dest);
  scriptPubKeyIn.super_CScriptBase._union._8_8_ = in_stack_ffffffffffffffa0;
  scriptPubKeyIn.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_ffffffffffffff98;
  scriptPubKeyIn.super_CScriptBase._16_16_ = in_stack_ffffffffffffffa8;
  CTxOut::CTxOut(&local_40,&recipient->nAmount,scriptPubKeyIn);
  if (0x1c < local_40.scriptPubKey.super_CScriptBase._size) {
    free(local_40.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    local_40.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < local_44) {
    free((void *)in_stack_ffffffffffffffa0);
  }
  uVar1 = local_40.scriptPubKey.super_CScriptBase._size - 0x1d;
  if (local_40.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar1 = local_40.scriptPubKey.super_CScriptBase._size;
  }
  lVar2 = 1;
  if (0xfc < uVar1) {
    lVar2 = (ulong)(0xffff < uVar1) * 2 + 3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (ulong)uVar1 + lVar2 + 8;
  }
  __stack_chk_fail();
}

Assistant:

size_t GetSerializeSizeForRecipient(const CRecipient& recipient)
{
    return ::GetSerializeSize(CTxOut(recipient.nAmount, GetScriptForDestination(recipient.dest)));
}